

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Promise<void> __thiscall
capnproto_test::capnp::test::TestExtends::Server::dispatchCall
          (Server *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  undefined6 in_register_00000012;
  Promise<void> PVar2;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  PromiseNode *pPVar1;
  
  if (CONCAT62(in_register_00000012,methodId) == -0x7714ed5f1f506d4e) {
    PVar2 = TestInterface::Server::dispatchCallInternal
                      ((Server *)this,
                       (uint16_t)interfaceId + (short)*(undefined8 *)(*(long *)interfaceId + -0x40),
                       (CallContextHook *)((ulong)context.hook & 0xffff));
    pPVar1 = PVar2.super_PromiseBase.node.ptr;
  }
  else if (CONCAT62(in_register_00000012,methodId) == -0x1b164536798f48b8) {
    PVar2 = dispatchCallInternal
                      (this,(uint16_t)interfaceId,(CallContextHook *)((ulong)context.hook & 0xffff))
    ;
    pPVar1 = PVar2.super_PromiseBase.node.ptr;
  }
  else {
    PVar2 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)(interfaceId + *(long *)(*(long *)interfaceId + -0x18)),0xa91dc2);
    pPVar1 = PVar2.super_PromiseBase.node.ptr;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestExtends::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (interfaceId) {
    case 0xe4e9bac98670b748ull:
      return dispatchCallInternal(methodId, context);
    case 0x88eb12a0e0af92b2ull:
      return  ::capnproto_test::capnp::test::TestInterface::Server::dispatchCallInternal(methodId, context);
    default:
      return internalUnimplemented("capnp/test.capnp:TestExtends", interfaceId);
  }
}